

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

void Ivy_ManCollectCut(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vNodes)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  int local_2c;
  int Leaf;
  int i;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vLeaves_local;
  Ivy_Obj_t *pRoot_local;
  Ivy_Man_t *p_local;
  
  Vec_IntClear(vNodes);
  for (local_2c = 0; iVar1 = Vec_IntSize(vLeaves), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vLeaves,local_2c);
    Vec_IntPush(vNodes,iVar1);
    pIVar2 = Ivy_ManObj(p,iVar1);
    *(uint *)&pIVar2->field_0x8 = *(uint *)&pIVar2->field_0x8 & 0xffffffef | 0x10;
  }
  Ivy_ManCollectCut_rec(p,pRoot,vNodes);
  for (local_2c = 0; iVar1 = Vec_IntSize(vNodes), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(vNodes,local_2c);
    pIVar2 = Ivy_ManObj(p,iVar1);
    *(uint *)&pIVar2->field_0x8 = *(uint *)&pIVar2->field_0x8 & 0xffffffef;
  }
  return;
}

Assistant:

void Ivy_ManCollectCut( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vNodes )
{
    int i, Leaf;
    // collect and mark the leaves
    Vec_IntClear( vNodes );
    Vec_IntForEachEntry( vLeaves, Leaf, i )
    {
        Vec_IntPush( vNodes, Leaf );
        Ivy_ManObj(p, Leaf)->fMarkA = 1;
    }
    // collect and mark the nodes
    Ivy_ManCollectCut_rec( p, pRoot, vNodes );
    // clean the nodes
    Vec_IntForEachEntry( vNodes, Leaf, i )
        Ivy_ManObj(p, Leaf)->fMarkA = 0;
}